

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O2

void __thiscall w3Interp::Invoke(w3Interp *this,w3Function *function)

{
  w3Stack *this_00;
  w3Code *code;
  w3Tag *pwVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  w3Tag wVar6;
  uint uVar7;
  w3InstructionEnum wVar8;
  w3Module *module;
  pointer pwVar9;
  pointer pwVar10;
  pointer pwVar11;
  pointer pwVar12;
  pointer pwVar13;
  pointer pwVar14;
  pointer pwVar15;
  w3DecodedInstruction *pwVar16;
  w3DecodedInstruction *pwVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined7 uVar22;
  long lVar23;
  pointer pwVar24;
  pointer pwVar25;
  size_t sVar26;
  char *pcVar27;
  size_t sVar28;
  size_t sVar29;
  pointer pwVar30;
  ulong uVar31;
  long lVar32;
  bool bVar33;
  uint8_t *cursor;
  undefined1 local_f0 [24];
  w3Code *local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  w3Interp *local_a0;
  size_t local_98;
  undefined1 local_90 [24];
  undefined1 local_78 [16];
  size_t local_68;
  w3StackValue ret;
  
  uVar31 = function->function_type_index;
  module = this->module;
  pwVar9 = (module->function_types).
           super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(module->function_types).
                     super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pwVar9) / 0x30) <= uVar31) {
    AssertFailed("function_type_index < module->function_types.size ()");
  }
  pwVar10 = (module->code).super__Vector_base<w3Code,_std::allocator<w3Code>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar26 = function->function_index;
  code = pwVar10 + sVar26;
  pwVar11 = pwVar10[sVar26].locals.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
            super__Vector_impl_data._M_start;
  pwVar12 = pwVar10[sVar26].locals.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pwVar13 = *(pointer *)
             &pwVar9[uVar31].parameters.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl;
  pwVar14 = pwVar9[uVar31].parameters.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
            super__Vector_impl_data._M_finish;
  cursor = pwVar10[sVar26].cursor;
  if (cursor != (uint8_t *)0x0) {
    DecodeFunction(module,code,&cursor);
    code->cursor = (uint8_t *)0x0;
  }
  lVar23 = (long)(code->decoded_instructions).
                 super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(code->decoded_instructions).
                 super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar23 == 0) {
    AssertFailed("size");
  }
  sVar28 = (long)pwVar12 - (long)pwVar11;
  sVar26 = (long)pwVar14 - (long)pwVar13;
  this_00 = &this->super_w3Stack;
  w3Stack::DumpStack(this_00,"invoke1");
  local_98 = 0;
  uVar4 = this->module;
  uVar5 = this->module_instance;
  local_f0._16_4_ = (int)uVar4;
  local_f0._8_8_ = uVar5;
  local_f0._20_4_ = (int)((ulong)uVar4 >> 0x20);
  local_f0._0_8_ = function->function_index;
  if (pwVar12 == pwVar11) {
    local_b8 = (pointer)0x0;
  }
  else {
    local_b8 = (code->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  local_a8 = pwVar9 + uVar31;
  if (pwVar14 == pwVar13) {
    local_b0 = (pointer)0x0;
  }
  else {
    local_b0 = (local_a8->parameters).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  ret.tag = Tag_Frame;
  ret.value.tag = Tag_none;
  ret.value._1_7_ = 0;
  ret.value.value = (Value)0x0;
  ret.frame = (w3Frame *)0x0;
  ret.label.arity = 0;
  ret.label.continuation = 0;
  this->frame = (w3Frame *)local_f0;
  local_d8 = code;
  local_d0 = sVar26;
  local_c8 = sVar28;
  local_c0 = sVar26 + sVar28;
  local_a0 = this;
  w3Stack::push_frame(this_00,&ret);
  w3Stack::DumpStack(this_00,"pushed_frame");
  uVar31 = (long)pwVar13 * 0x30 + (long)pwVar14 * -0x30 | 8;
  for (sVar29 = 0; sVar26 != sVar29; sVar29 = sVar29 + 1) {
    printf("2 entering function with param [%lX] type %X\n",sVar29,
           (ulong)(&((this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                     super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                     super__Vector_impl_data._M_finish)->tag)[uVar31]);
    uVar31 = uVar31 + 0x30;
  }
  if (pwVar14 != pwVar13) {
    lVar32 = -0x30;
    sVar29 = sVar26;
    while (bVar33 = sVar29 != 0, sVar29 = sVar29 - 1, bVar33) {
      w3Stack::DumpStack(this_00,"moved_param_before");
      pwVar15 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pwVar1 = &pwVar15[-1].tag + lVar32;
      uVar18 = *(undefined8 *)pwVar1;
      wVar6 = ((TaggedValue *)(pwVar1 + 8))->tag;
      uVar22 = *(undefined7 *)&((TaggedValue *)(pwVar1 + 8))->field_0x1;
      puVar2 = (undefined8 *)((long)pwVar15 + lVar32 + -0x20);
      uVar19 = *puVar2;
      uVar20 = puVar2[1];
      puVar2 = (undefined8 *)((long)pwVar15 + lVar32 + -0x10);
      uVar21 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(pwVar15->label).arity + lVar32);
      *puVar3 = *puVar2;
      puVar3[1] = uVar21;
      puVar2 = (undefined8 *)((long)&(pwVar15->value).value + lVar32);
      *puVar2 = uVar19;
      puVar2[1] = uVar20;
      pwVar1 = &pwVar15->tag + lVar32;
      *(undefined8 *)pwVar1 = uVar18;
      ((TaggedValue *)(pwVar1 + 8))->tag = wVar6;
      *(undefined7 *)&((TaggedValue *)(pwVar1 + 8))->field_0x1 = uVar22;
      w3Stack::DumpStack(this_00,"moved_param_after");
      lVar32 = lVar32 + -0x30;
    }
  }
  (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
  super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1 - sVar26].tag = Tag_Frame;
  w3Stack::DumpStack(this_00,"push_locals_before");
  for (sVar29 = 0; sVar28 != sVar29; sVar29 = sVar29 + 1) {
    wVar6 = (code->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
            super__Vector_impl_data._M_start[sVar29];
    local_68 = 0;
    local_78 = (undefined1  [16])0x0;
    local_90[8] = Tag_none;
    local_90._9_7_ = 0;
    local_90._16_8_ = (Value)0x0;
    local_90[0] = wVar6;
    if ((~wVar6 & 0x78) == 0) {
      local_90[0] = Tag_Value;
      local_90._9_15_ = SUB1615((undefined1  [16])0x0,1);
      local_90[8] = wVar6;
    }
    w3Stack::push_value(this_00,(w3StackValue *)local_90);
  }
  w3Stack::DumpStack(this_00,"push_locals_after");
  local_98 = ((long)(this->stack->super_w3StackBase).super_w3StackBaseBase.
                    super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->stack->super_w3StackBase).super_w3StackBaseBase.
                   super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x30 - (sVar26 + sVar28);
  lVar32 = 8;
  for (pwVar30 = (pointer)0x0; pwVar14 + (long)pwVar12 + (-(long)pwVar11 - (long)pwVar13) != pwVar30
      ; pwVar30 = pwVar30 + 1) {
    printf("2 entering function with local [%lX] type %X\n",pwVar30,
           (ulong)(&(local_a0->stack->super_w3StackBase).super_w3StackBaseBase.
                    super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                    super__Vector_impl_data._M_start[local_98].tag)[lVar32]);
    lVar32 = lVar32 + 0x30;
  }
  pwVar16 = (this->super_Wasm).instr;
  pwVar24 = (code->decoded_instructions).
            super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->super_Wasm).instr = pwVar24;
  pwVar25 = (pointer)(lVar23 + (long)pwVar24);
  while (pwVar24 < pwVar25) {
    if (pwVar24 == (pointer)0x0) {
      AssertFailed("instr");
    }
    switch((pwVar24->super_w3DecodedInstructionZeroInit).name) {
    case Unreach:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Unreach",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      AssertFailed("!\"unreach\"");
    case Nop:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Nop",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      break;
    case Block:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Block",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Block(this);
      break;
    case Loop:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Loop",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Loop(this);
      break;
    case If:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","If",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      If(this);
      break;
    case Else:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Else",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Else(this);
      break;
    case Reserved06:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved06";
      goto LAB_0011b3ab;
    case Reserved07:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved07";
      goto LAB_0011b3ab;
    case Reserved08:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved08";
      goto LAB_0011b3ab;
    case Reserved09:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved09";
      goto LAB_0011b3ab;
    case Reserved0A:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved0A";
      goto LAB_0011b3ab;
    case BlockEnd:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","BlockEnd",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      BlockEnd(this);
      break;
    case Br:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Br",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Br(this);
      break;
    case BrIf:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","BrIf",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      BrIf(this);
      break;
    case BrTable:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","BrTable",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      AssertFailed("!\"BrTable\"");
    case Ret:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ret",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ret(this);
      break;
    case Call:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Call",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Call(this);
      break;
    case Calli:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Calli",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Calli(this);
      break;
    case Reserved12:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved12";
      goto LAB_0011b3ab;
    case Reserved13:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved13";
      goto LAB_0011b3ab;
    case Reserved14:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved14";
      goto LAB_0011b3ab;
    case Reserved15:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved15";
      goto LAB_0011b3ab;
    case Reserved16:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved16";
      goto LAB_0011b3ab;
    case Reserved17:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved17";
      goto LAB_0011b3ab;
    case Reserved18:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved18";
      goto LAB_0011b3ab;
    case Reserved19:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved19";
      goto LAB_0011b3ab;
    case Drop:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Drop",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      w3Stack::pop_value(this_00);
      break;
    case Select:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Select",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Select(this);
      break;
    case Reserved1C:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved1C";
      goto LAB_0011b3ab;
    case Reserved1D:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved1D";
      goto LAB_0011b3ab;
    case Reserved1E:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved1E";
      goto LAB_0011b3ab;
    case Reserved1F:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved1F";
      goto LAB_0011b3ab;
    case Local_get:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Local_get",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Local_get(this);
      break;
    case Local_set:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Local_set",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Local_set(this);
      break;
    case Local_tee:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Local_tee",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Local_tee(this);
      break;
    case Global_get:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Global_get",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Global_get(this);
      break;
    case Global_set:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Global_set",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Global_set(this);
      break;
    case Reserved25:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved25";
      goto LAB_0011b3ab;
    case Reserved26:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved26";
      goto LAB_0011b3ab;
    case Reserved27:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "Reserved27";
      goto LAB_0011b3ab;
    case i32_Load_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Load_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Load_(this);
      break;
    case i64_Load_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Load_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Load_(this);
      break;
    case f32_Load_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Load_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Load_(this);
      break;
    case f64_Load_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Load_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Load_(this);
      break;
    case i32_Load8s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Load8s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Load8s(this);
      break;
    case i32_Load8u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Load8u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Load8u(this);
      break;
    case i32_Load16s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Load16s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Load16s(this);
      break;
    case i32_Load16u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Load16u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Load16u(this);
      break;
    case i64_Load8s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Load8s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Load8s(this);
      break;
    case i64_Load8u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Load8u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Load8u(this);
      break;
    case i64_Load16s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Load16s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Load16s(this);
      break;
    case i64_Load16u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Load16u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Load16u(this);
      break;
    case i64_Load32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Load32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Load32s(this);
      break;
    case i64_Load32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Load32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Load32u(this);
      break;
    case i32_Store_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Store_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Store_(this);
      break;
    case i64_Store_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Store_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Store_(this);
      break;
    case f32_Store_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Store_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Store_(this);
      break;
    case f64_Store_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Store_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Store_(this);
      break;
    case i32_Store8:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Store8",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Store8(this);
      break;
    case i32_Store16:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Store16",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Store16(this);
      break;
    case i64_Store8:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Store8",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Store8(this);
      break;
    case i64_Store16:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Store16",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Store16(this);
      break;
    case i64_Store32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Store32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Store32(this);
      break;
    case MemSize:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","MemSize",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      MemSize(this);
      break;
    case MemGrow:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","MemGrow",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      MemGrow(this);
      break;
    case i32_Const:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Const",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Const(this);
      break;
    case i64_Const:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Const",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Const(this);
      break;
    case f32_Const:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Const",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Const(this);
      break;
    case f64_Const:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Const",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Const(this);
      break;
    case Eqz_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Eqz_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Eqz_i32(this);
      break;
    case Eq_i32_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Eq_i32_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Eq_i32_(this);
      break;
    case Ne_i32_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ne_i32_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ne_i32_(this);
      break;
    case Lt_i32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Lt_i32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Lt_i32s(this);
      break;
    case Lt_i32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Lt_i32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Lt_i32u(this);
      break;
    case Gt_i32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Gt_i32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Gt_i32s(this);
      break;
    case Gt_i32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Gt_i32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Gt_i32u(this);
      break;
    case Le_i32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Le_i32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Le_i32s(this);
      break;
    case Le_i32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Le_i32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Le_i32u(this);
      break;
    case Ge_i32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ge_i32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ge_i32s(this);
      break;
    case Ge_i32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ge_i32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ge_i32u(this);
      break;
    case Eqz_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Eqz_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Eqz_i64(this);
      break;
    case Eq_i64_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Eq_i64_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Eq_i64_(this);
      break;
    case Ne_i64_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ne_i64_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ne_i64_(this);
      break;
    case Lt_i64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Lt_i64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Lt_i64s(this);
      break;
    case Lt_i64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Lt_i64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Lt_i64u(this);
      break;
    case Gt_i64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Gt_i64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Gt_i64s(this);
      break;
    case Gt_i64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Gt_i64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Gt_i64u(this);
      break;
    case Le_i64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Le_i64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Le_i64s(this);
      break;
    case Le_i64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Le_i64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Le_i64u(this);
      break;
    case Ge_i64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ge_i64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ge_i64s(this);
      break;
    case Ge_i64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ge_i64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ge_i64u(this);
      break;
    case Eq_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Eq_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Eq_f32(this);
      break;
    case Ne_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ne_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ne_f32(this);
      break;
    case Lt_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Lt_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Lt_f32(this);
      break;
    case Gt_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Gt_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Gt_f32(this);
      break;
    case Le_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Le_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Le_f32(this);
      break;
    case Ge_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ge_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ge_f32(this);
      break;
    case Eq_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Eq_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Eq_f64(this);
      break;
    case Ne_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ne_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ne_f64(this);
      break;
    case Lt_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Lt_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Lt_f64(this);
      break;
    case Gt_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Gt_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Gt_f64(this);
      break;
    case Le_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Le_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Le_f64(this);
      break;
    case Ge_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ge_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ge_f64(this);
      break;
    case CountLeadingZeros_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i32",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      CountLeadingZeros_i32(this);
      break;
    case CountTrailingZeros_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i32",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      CountTrailingZeros_i32(this);
      break;
    case CountSetBits_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      CountSetBits_i32(this);
      break;
    case Add_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Add_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Add_i32(this);
      break;
    case Sub_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Sub_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Sub_i32(this);
      break;
    case Mul_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Mul_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Mul_i32(this);
      break;
    case Div_s_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Div_s_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Div_s_i32(this);
      break;
    case Div_u_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Div_u_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Div_u_i32(this);
      break;
    case Rem_s_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rem_s_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rem_s_i32(this);
      break;
    case Rem_u_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rem_u_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rem_u_i32(this);
      break;
    case And_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","And_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      And_i32(this);
      break;
    case Or_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Or_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Or_i32(this);
      break;
    case Xor_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Xor_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Xor_i32(this);
      break;
    case Shl_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Shl_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Shl_i32(this);
      break;
    case Shr_s_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Shr_s_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Shr_s_i32(this);
      break;
    case Shr_u_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Shr_u_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Shr_u_i32(this);
      break;
    case Rotl_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rotl_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rotl_i32(this);
      break;
    case Rotr_i32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rotr_i32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rotr_i32(this);
      break;
    case CountLeadingZeros_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i64",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      CountLeadingZeros_i64(this);
      break;
    case CountTrailingZeros_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i64",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      CountTrailingZeros_i64(this);
      break;
    case CountSetBits_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      CountSetBits_i64(this);
      break;
    case Add_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Add_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Add_i64(this);
      break;
    case Sub_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Sub_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Sub_i64(this);
      break;
    case Mul_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Mul_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Mul_i64(this);
      break;
    case Div_s_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Div_s_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Div_s_i64(this);
      break;
    case Div_u_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Div_u_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Div_u_i64(this);
      break;
    case Rem_s_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rem_s_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rem_s_i64(this);
      break;
    case Rem_u_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rem_u_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rem_u_i64(this);
      break;
    case And_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","And_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      And_i64(this);
      break;
    case Or_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Or_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Or_i64(this);
      break;
    case Xor_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Xor_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Xor_i64(this);
      break;
    case Shl_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Shl_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Shl_i64(this);
      break;
    case Shr_s_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Shr_s_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Shr_s_i64(this);
      break;
    case Shr_u_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Shr_u_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Shr_u_i64(this);
      break;
    case Rotl_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rotl_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rotl_i64(this);
      break;
    case Rotr_i64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Rotr_i64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Rotr_i64(this);
      break;
    case Abs_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Abs_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Abs_f32(this);
      break;
    case Neg_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Neg_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Neg_f32(this);
      break;
    case Ceil_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ceil_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ceil_f32(this);
      break;
    case Floor_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Floor_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Floor_f32(this);
      break;
    case Trunc_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Trunc_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Trunc_f32(this);
      break;
    case Nearest_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Nearest_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Nearest_f32(this);
      break;
    case Sqrt_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Sqrt_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Sqrt_f32(this);
      break;
    case Add_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Add_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Add_f32(this);
      break;
    case Sub_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Sub_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Sub_f32(this);
      break;
    case Mul_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Mul_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Mul_f32(this);
      break;
    case Div_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Div_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Div_f32(this);
      break;
    case Min_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Min_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Min_f32(this);
      break;
    case Max_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Max_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Max_f32(this);
      break;
    case Copysign_f32:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Copysign_f32",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Copysign_f32(this);
      break;
    case Abs_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Abs_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Abs_f64(this);
      break;
    case Neg_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Neg_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Neg_f64(this);
      break;
    case Ceil_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Ceil_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Ceil_f64(this);
      break;
    case Floor_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Floor_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Floor_f64(this);
      break;
    case Trunc_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Trunc_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Trunc_f64(this);
      break;
    case Nearest_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Nearest_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Nearest_f64(this);
      break;
    case Sqrt_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Sqrt_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Sqrt_f64(this);
      break;
    case Add_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Add_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Add_f64(this);
      break;
    case Sub_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Sub_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Sub_f64(this);
      break;
    case Mul_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Mul_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Mul_f64(this);
      break;
    case Div_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Div_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Div_f64(this);
      break;
    case Min_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Min_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Min_f64(this);
      break;
    case Max_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Max_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Max_f64(this);
      break;
    case Copysign_f64:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","Copysign_f64",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      Copysign_f64(this);
      break;
    case i32_Wrap_i64_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Wrap_i64_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Wrap_i64_(this);
      break;
    case i32_Trunc_f32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Trunc_f32s(this);
      break;
    case i32_Trunc_f32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Trunc_f32u(this);
      break;
    case i32_Trunc_f64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Trunc_f64s(this);
      break;
    case i32_Trunc_f64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i32_Trunc_f64u(this);
      break;
    case i64_Extend_i32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Extend_i32s(this);
      break;
    case i64_Extend_i32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Extend_i32u(this);
      break;
    case i64_Trunc_f32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Trunc_f32s(this);
      break;
    case i64_Trunc_f32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Trunc_f32u(this);
      break;
    case i64_Trunc_f64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Trunc_f64s(this);
      break;
    case i64_Trunc_f64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      i64_Trunc_f64u(this);
      break;
    case f32_Convert_i32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Convert_i32u(this);
      break;
    case f32_Convert_i32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Convert_i32s(this);
      break;
    case f32_Convert_i64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Convert_i64u(this);
      break;
    case f32_Convert_i64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Convert_i64s(this);
      break;
    case f32_Demote_f64_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Demote_f64_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f32_Demote_f64_(this);
      break;
    case f64_Convert_i32s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Convert_i32s(this);
      break;
    case f64_Convert_i32u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Convert_i32u(this);
      break;
    case f64_Convert_i64s:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64s",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Convert_i64s(this);
      break;
    case f64_Convert_i64u:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64u",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Convert_i64u(this);
      break;
    case f64_Promote_f32_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Promote_f32_",(ulong)uVar7,(ulong)uVar7,(ulong)uVar7);
      f64_Promote_f32_(this);
      break;
    case i32_Reinterpret_f32_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i32_Reinterpret_f32_",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      i32_Reinterpret_f32_(this);
      break;
    case i64_Reinterpret_f64_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","i64_Reinterpret_f64_",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      i64_Reinterpret_f64_(this);
      break;
    case f32_Reinterpret_i32_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f32_Reinterpret_i32_",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      f32_Reinterpret_i32_(this);
      break;
    case f64_Reinterpret_i64_:
      uVar7 = (pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      printf("interp%s x:%X u:%u i:%i\n","f64_Reinterpret_i64_",(ulong)uVar7,(ulong)uVar7,
             (ulong)uVar7);
      f64_Reinterpret_i64_(this);
      break;
    case ReservedC0:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC0";
      goto LAB_0011b3ab;
    case ReservedC1:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC1";
      goto LAB_0011b3ab;
    case ReservedC2:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC2";
      goto LAB_0011b3ab;
    case ReservedC3:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC3";
      goto LAB_0011b3ab;
    case ReservedC4:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC4";
      goto LAB_0011b3ab;
    case ReservedC5:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC5";
      goto LAB_0011b3ab;
    case ReservedC6:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC6";
      goto LAB_0011b3ab;
    case ReservedC7:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC7";
      goto LAB_0011b3ab;
    case ReservedC8:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC8";
      goto LAB_0011b3ab;
    case ReservedC9:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedC9";
      goto LAB_0011b3ab;
    case ReservedCA:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedCA";
      goto LAB_0011b3ab;
    case ReservedCB:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedCB";
      goto LAB_0011b3ab;
    case ReservedCC:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedCC";
      goto LAB_0011b3ab;
    case ReservedCD:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedCD";
      goto LAB_0011b3ab;
    case ReservedCE:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedCE";
      goto LAB_0011b3ab;
    case ReservedCF:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedCF";
      goto LAB_0011b3ab;
    case ReservedD0:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD0";
      goto LAB_0011b3ab;
    case ReservedD1:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD1";
      goto LAB_0011b3ab;
    case ReservedD2:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD2";
      goto LAB_0011b3ab;
    case ReservedD3:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD3";
      goto LAB_0011b3ab;
    case ReservedD4:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD4";
      goto LAB_0011b3ab;
    case ReservedD5:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD5";
      goto LAB_0011b3ab;
    case ReservedD6:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD6";
      goto LAB_0011b3ab;
    case ReservedD7:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD7";
      goto LAB_0011b3ab;
    case ReservedD8:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD8";
      goto LAB_0011b3ab;
    case ReservedD9:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedD9";
      goto LAB_0011b3ab;
    case ReservedDA:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedDA";
      goto LAB_0011b3ab;
    case ReservedDB:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedDB";
      goto LAB_0011b3ab;
    case ReservedDC:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedDC";
      goto LAB_0011b3ab;
    case ReservedDD:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedDD";
      goto LAB_0011b3ab;
    case ReservedDE:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedDE";
      goto LAB_0011b3ab;
    case ReservedDF:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedDF";
      goto LAB_0011b3ab;
    case ReservedE0:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE0";
      goto LAB_0011b3ab;
    case ReservedE1:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE1";
      goto LAB_0011b3ab;
    case ReservedE2:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE2";
      goto LAB_0011b3ab;
    case ReservedE3:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE3";
      goto LAB_0011b3ab;
    case ReservedE4:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE4";
      goto LAB_0011b3ab;
    case ReservedE5:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE5";
      goto LAB_0011b3ab;
    case ReservedE6:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE6";
      goto LAB_0011b3ab;
    case ReservedE7:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE7";
      goto LAB_0011b3ab;
    case ReservedE8:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE8";
      goto LAB_0011b3ab;
    case ReservedE9:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedE9";
      goto LAB_0011b3ab;
    case ReservedEA:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedEA";
      goto LAB_0011b3ab;
    case ReservedEB:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedEB";
      goto LAB_0011b3ab;
    case ReservedEC:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedEC";
      goto LAB_0011b3ab;
    case ReservedED:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedED";
      goto LAB_0011b3ab;
    case ReservedEE:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedEE";
      goto LAB_0011b3ab;
    case ReservedEF:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedEF";
      goto LAB_0011b3ab;
    case ReservedF0:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF0";
      goto LAB_0011b3ab;
    case ReservedF1:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF1";
      goto LAB_0011b3ab;
    case ReservedF2:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF2";
      goto LAB_0011b3ab;
    case ReservedF3:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF3";
      goto LAB_0011b3ab;
    case ReservedF4:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF4";
      goto LAB_0011b3ab;
    case ReservedF5:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF5";
      goto LAB_0011b3ab;
    case ReservedF6:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF6";
      goto LAB_0011b3ab;
    case ReservedF7:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF7";
      goto LAB_0011b3ab;
    case ReservedF8:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF8";
      goto LAB_0011b3ab;
    case ReservedF9:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedF9";
      goto LAB_0011b3ab;
    case ReservedFA:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedFA";
      goto LAB_0011b3ab;
    case ReservedFB:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedFB";
      goto LAB_0011b3ab;
    case ReservedFC:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedFC";
      goto LAB_0011b3ab;
    case ReservedFD:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedFD";
      goto LAB_0011b3ab;
    case ReservedFE:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedFE";
      goto LAB_0011b3ab;
    case ReservedFF:
      uVar31 = (ulong)(pwVar24->super_w3DecodedInstructionZeroInit).field_0.u32;
      pcVar27 = "ReservedFF";
LAB_0011b3ab:
      printf("interp%s x:%X u:%u i:%i\n",pcVar27,uVar31,uVar31,uVar31);
      (*(this->super_Wasm)._vptr_Wasm[2])(this);
      (*(this->super_Wasm)._vptr_Wasm[2])(this);
    }
    pwVar17 = (this->super_Wasm).instr;
    wVar8 = (pwVar17->super_w3DecodedInstructionZeroInit).name;
    if (wVar8 - Call < 2) {
      this->frame = (w3Frame *)local_f0;
    }
    else if (wVar8 == Ret) break;
    pwVar24 = pwVar17 + 1;
    (this->super_Wasm).instr = pwVar24;
  }
  (this->super_Wasm).instr = pwVar16;
  return;
}

Assistant:

void w3Interp::Invoke (w3Function& function)
{
    //__debugbreak ();
    // Decode function upon first call.
    // TODO thread safety
    // TODO merge with calli (invoke)

    const size_t function_type_index = function.function_type_index;
    Assert (function_type_index < module->function_types.size ());
    w3FunctionType* function_type = &module->function_types [function_type_index];
    w3Code* code = &module->code [function.function_index];
    const size_t local_only_count = code->locals.size ();
    const size_t param_count = function_type->parameters.size ();

    uint8_t* cursor = code->cursor;
    if (cursor)
    {
        DecodeFunction (module, code, &cursor);
        code->cursor = 0;
    }
    const size_t size = code->decoded_instructions.size ();
    Assert (size);

    DumpStack ("invoke1");

    // TODO cross-module calls
    // TODO calling embedding
    // setup frame
    w3Frame frame_value;
    frame_value.interp = this;
    frame_value.code = code;
    frame_value.module = this->module; // TODO cross module calls
    frame_value.module_instance = this->module_instance; // TODO cross module calls
    frame_value.function_index = function.function_index;
    frame_value.param_count = param_count;
    frame_value.param_and_local_count = local_only_count + param_count; // TODO overflow
    frame_value.local_only_count = local_only_count;
    frame_value.local_only_types = local_only_count ? &code->locals [0] : 0;
    frame_value.param_types = param_count ? &function_type->parameters [0] : 0;
    frame_value.function_type = function_type;

    w3StackValue ret (frame);
    this->frame = &frame_value;
    push_frame (ret);
    DumpStack ("pushed_frame");

    size_t i = 0;
    size_t j = 0;

    for (j = 0; j != param_count; ++j)
    {
        printf ("2 entering function with param [%" FORMAT_SIZE "X] type %X\n", j, (end () - (ssize_t)param_count + (ssize_t)j)->value.tag);
    }

    // CONSIDER put the interp loop elsewhere
    // Invoke would adjust member data and return to it

    // params are subsumed into new frame

    // TODO We really want this to be more efficient.
    // Either by having split stacks, or by computing
    // maximum parameter count and putting return before it.

    // For now live with memcpy or slower (stack is not presently contiguous)..

    if (param_count)
    {
        for (i = 0; i < param_count; ++i)
        {
            DumpStack ("moved_param_before");
            *(end () - 1 - (ssize_t)i) = *(end () - 2 - (ssize_t)i);
            DumpStack ("moved_param_after");
        }
    }

    // place return frame/address (frame is just a marker now, the data is on the native stack)

    (end () - 1 - (ssize_t)param_count)->tag = Tag_Frame;
    //(end () - 1 - param_count)->frame = frame;
    //(end () - 1 - param_count)->instr = instr + !!instr;

    // Push locals on stack.
    // TODO params also
    // TODO reserve (size () + local_only_count);
    DumpStack ("push_locals_before");
    for (i = 0; i != local_only_count; ++i)
        push_value (w3StackValue (code->locals [i]));

    DumpStack ("push_locals_after");
    // Provide for indexing locals.
    frame_value.locals = stack.size () - local_only_count - param_count;

    for (j = 0; j != local_only_count + param_count; ++j)
        printf ("2 entering function with local [%" FORMAT_SIZE "X] type %X\n", j, frame_value.Local (j).value.tag);

    //DumpStack ("invoke2");

    // TODO provide for separate depth -- i.e. here is now 0; locals/params cannot be popped

    w3DecodedInstruction* previous = instr; // call/ret handling
    instr = &code->decoded_instructions [0];
    w3DecodedInstruction* end = instr + size;
    for (; instr < end; ++instr) // Br subtracts one so this works.
    {
        Assert (instr);
        switch (instr->name)
        {
            // break before instead of after to avoid unreachable code warning
#undef RESERVED
#define RESERVED(b0) INSTRUCTION (0x ## b0, 0, 0, Reserved ## b0, Imm_none, 0, 0, Tag_none, Tag_none, Tag_none, Tag_none) { Reserved (); }

#undef INSTRUCTION
#define INSTRUCTION(byte0, fixed_size, byte1, name, imm, pop, push, in0, in1, in2, out0)     \
            break;                                                                           \
            case ::name:                                                                   \
            printf ("interp%s x:%X u:%u i:%i\n", #name, instr->u32, instr->u32, instr->u32); \
            this->name ();
#include "w3Instructions.h"
        }
        // special handling
        if (instr->name == ::Ret) // gross but most choices are
            break;
#include "diag-switch-push.h"
        switch (instr->name)
        {
        case ::Call:
        case ::Calli:
            frame = &frame_value; // TODO should handled in Ret.
            break;
        }
#include "diag-switch-pop.h"
    }
    instr = previous;
    // TODO handle ret
    //__debugbreak ();
}